

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logconf.c
# Opt level: O0

char * append_unsafe_string_json(char *pos,char *src,size_t len)

{
  char *pcVar1;
  char *src_end;
  size_t len_local;
  char *src_local;
  char *pos_local;
  
  src_local = pos;
  for (len_local = (size_t)src; (char *)len_local != src + len; len_local = len_local + 1) {
    if ((*(char *)len_local < ' ') || ('}' < *(char *)len_local)) {
      *src_local = '\\';
      src_local[1] = 'u';
      src_local[2] = '0';
      src_local[3] = '0';
      pcVar1 = src_local + 5;
      src_local[4] = "0123456789abcdef"[(int)((int)*(char *)len_local >> 4 & 0xf)];
      src_local = src_local + 6;
      *pcVar1 = "0123456789abcdef"[(int)((int)*(char *)len_local & 0xf)];
    }
    else {
      if ((*(char *)len_local == '\"') || (*(char *)len_local == '\\')) {
        *src_local = '\\';
        src_local = src_local + 1;
      }
      *src_local = *(char *)len_local;
      src_local = src_local + 1;
    }
  }
  return src_local;
}

Assistant:

static char *append_unsafe_string_json(char *pos, const char *src, size_t len)
{
    const char *src_end = src + len;

    for (; src != src_end; ++src) {
        if (' ' <= *src && *src < 0x7e) {
            if (*src == '"' || *src == '\\')
                *pos++ = '\\';
            *pos++ = *src;
        } else {
            *pos++ = '\\';
            *pos++ = 'u';
            *pos++ = '0';
            *pos++ = '0';
            *pos++ = ("0123456789abcdef")[(*src >> 4) & 0xf];
            *pos++ = ("0123456789abcdef")[*src & 0xf];
        }
    }

    return pos;
}